

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_68f54f::ForcedKeyTestLarge::Frame1IsKey(ForcedKeyTestLarge *this)

{
  int iVar1;
  uint uVar2;
  int limit;
  bool bVar3;
  Message *pMVar4;
  pointer *__ptr;
  SEARCH_METHODS *message;
  long lVar5;
  AssertHelper local_d8;
  AssertHelper local_d0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  iVar1 = *(int *)&(this->super_EncoderTest).field_0x3dc;
  this->forced_kf_frame_num_ = 1;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 3) {
      return;
    }
    uVar2 = *(uint *)(&DAT_00aa6550 + (ulong)(iVar1 == 0) * 0xc + lVar5 * 4);
    if (uVar2 != 0xffffffff) break;
LAB_004a21c9:
    lVar5 = lVar5 + 1;
  }
  this->frame_num_ = 0;
  (this->super_EncoderTest).cfg_.g_lag_in_frames = uVar2;
  this->is_kf_placement_violated_ = false;
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_d8);
  limit = 0x3c;
  if (this->fwd_kf_enabled_ == 0) {
    limit = 0x1e;
  }
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,0x1e,1,0,limit);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*(this->super_EncoderTest)._vptr_EncoderTest[2])(&this->super_EncoderTest,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      local_d8.data_._0_1_ = (allocator)0x0;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_fatal_failure_checker,"is_kf_placement_violated_","false",
                 &this->is_kf_placement_violated_,(bool *)&local_d8);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_d8);
        std::operator<<((ostream *)(CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) + 0x10),
                        "Frame #");
        pMVar4 = testing::Message::operator<<((Message *)&local_d8,&this->frame_num_);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [19])" isn\'t a keyframe!");
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
                   ,0x13a,(char *)message);
        testing::internal::AssertHelper::operator=(&local_d0,pMVar4);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if ((long *)CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        goto LAB_004a22bd;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
      goto LAB_004a21c9;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
             ,0x139,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_004a22bd:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

void ForcedKeyTestLarge::Frame1IsKey() {
  const aom_rational timebase = { 1, 30 };
  // 1st element of this 2D array is for good encoding mode and 2nd element
  // is for RT encoding mode.
  const int lag_values[2][NUM_LAG_VALUES] = { { 3, 15, 25 }, { 0, -1, -1 } };
  int is_realtime = (encoding_mode_ == ::libaom_test::kRealTime);

  forced_kf_frame_num_ = 1;
  for (int i = 0; i < NUM_LAG_VALUES; ++i) {
    if (lag_values[is_realtime][i] == -1) continue;
    frame_num_ = 0;
    cfg_.g_lag_in_frames = lag_values[is_realtime][i];
    is_kf_placement_violated_ = false;
    libaom_test::I420VideoSource video(
        TestFileName(), TestFileWidth(), TestFileHeight(), timebase.den,
        timebase.num, 0, fwd_kf_enabled_ ? 60 : 30);
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_EQ(is_kf_placement_violated_, false)
        << "Frame #" << frame_num_ << " isn't a keyframe!";
  }
}